

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::EHBailoutPatchUp(Lowerer *this)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  RegionType RVar4;
  bool bVar5;
  undefined4 *puVar6;
  LabelInstr *restoreLabel;
  Instr *pIVar7;
  LabelInstr *this_00;
  Region *pRVar8;
  BailOutInfo *pBVar9;
  Instr *insertAfterInstr;
  bool local_89;
  bool local_79;
  Region *local_70;
  Region *parent;
  Instr *pIStack_60;
  RegionType currentRegionType;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  bool restoreReturnFromBailoutEmitted;
  Instr *tmpInstr;
  Instr *exitPrevInstr;
  LabelInstr *epilogLabel;
  LabelInstr *restoreReturnValueFromBailoutLabel;
  Lowerer *this_local;
  
  if ((*(uint *)&this->m_func->field_0x240 >> 0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x57df,"(this->m_func->isPostLayout)","this->m_func->isPostLayout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  restoreLabel = IR::LabelInstr::New(Label,this->m_func,false);
  pIVar7 = IR::Instr::GetPrevRealInstrOrLabel(this->m_func->m_exitInstr);
  IVar3 = IR::Instr::GetKind(pIVar7);
  local_79 = true;
  if (IVar3 != InstrKindLabel) {
    local_79 = IR::Instr::IsProfiledLabelInstr(pIVar7);
  }
  if (local_79 == false) {
    exitPrevInstr = &IR::LabelInstr::New(Label,this->m_func,false)->super_Instr;
    IR::Instr::InsertBefore(this->m_func->m_exitInstr,exitPrevInstr);
  }
  else {
    exitPrevInstr = &IR::Instr::AsLabelInstr(pIVar7)->super_Instr;
  }
  bVar2 = false;
  pIVar7 = this->m_func->m_headInstr;
LAB_007e39ec:
  do {
    pIStack_60 = pIVar7;
    if (pIStack_60 == (Instr *)0x0) {
      return;
    }
    pIVar7 = pIStack_60->m_next;
    IVar3 = IR::Instr::GetKind(pIStack_60);
    local_89 = true;
    if (IVar3 != InstrKindLabel) {
      local_89 = IR::Instr::IsProfiledLabelInstr(pIStack_60);
    }
    if (local_89 != false) {
      this_00 = IR::Instr::AsLabelInstr(pIStack_60);
      pRVar8 = IR::LabelInstr::GetRegion(this_00);
      this->currentRegion = pRVar8;
    }
  } while ((this->currentRegion == (Region *)0x0) ||
          (((RVar4 = Region::GetType(this->currentRegion), RVar4 != RegionTypeTry &&
            (RVar4 != RegionTypeCatch)) && (RVar4 != RegionTypeFinally))));
  bVar5 = Region::IsNonExceptingFinally(this->currentRegion);
  if (bVar5) goto LAB_007e3ac5;
  goto LAB_007e3b0f;
LAB_007e3ac5:
  local_70 = Region::GetParent(this->currentRegion);
  while (bVar5 = Region::IsNonExceptingFinally(local_70), bVar5) {
    local_70 = Region::GetParent(local_70);
  }
  RVar4 = Region::GetType(local_70);
  if (RVar4 != RegionTypeRoot) {
LAB_007e3b0f:
    InsertReturnThunkForRegion(this,this->currentRegion,restoreLabel);
    bVar5 = IR::Instr::HasBailOutInfo(pIStack_60);
    if (bVar5) {
      pBVar9 = IR::Instr::GetBailOutInfo(pIStack_60);
      if (pBVar9->bailOutFunc == this->m_func) {
        SetHasBailedOut(this,pIStack_60);
      }
      insertAfterInstr = EmitEHBailoutStackRestore(this,pIStack_60);
      EmitSaveEHBailoutReturnValueAndJumpToRetThunk(this,insertAfterInstr);
      if (!bVar2) {
        EmitRestoreReturnValueFromEHBailout(this,restoreLabel,(LabelInstr *)exitPrevInstr);
        bVar2 = true;
      }
    }
  }
  goto LAB_007e39ec;
}

Assistant:

void
Lowerer::EHBailoutPatchUp()
{
    Assert(this->m_func->isPostLayout);
    // 1. Insert return thunks for all the regions.
    // 2. Set the hasBailedOut bit to true on all bailout paths in EH regions.
    // 3. Insert code after every bailout in a try or catch region to save the return value on the stack, and jump to the return thunk (See Region.h) of that region.
    // 4. Insert code right before the epilog, to restore the return value (saved in 2.) from a bailout into eax.

    IR::LabelInstr * restoreReturnValueFromBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    IR::LabelInstr * epilogLabel;
    IR::Instr * exitPrevInstr = this->m_func->m_exitInstr->GetPrevRealInstrOrLabel();
    if (exitPrevInstr->IsLabelInstr())
    {
        epilogLabel = exitPrevInstr->AsLabelInstr();
    }
    else
    {
        epilogLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        this->m_func->m_exitInstr->InsertBefore(epilogLabel);
    }

    IR::Instr * tmpInstr = nullptr;
    bool restoreReturnFromBailoutEmitted = false;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->m_func)
    {
        if (instr->IsLabelInstr())
        {
            this->currentRegion = instr->AsLabelInstr()->GetRegion();
        }

        // Consider (radua): Assert(this->currentRegion) here?
        if (this->currentRegion)
        {
            RegionType currentRegionType = this->currentRegion->GetType();
            if (currentRegionType == RegionTypeTry || currentRegionType == RegionTypeCatch || currentRegionType == RegionTypeFinally)
            {
                if (this->currentRegion->IsNonExceptingFinally())
                {
                    Region * parent = this->currentRegion->GetParent();

                    while (parent->IsNonExceptingFinally())
                    {
                        parent = parent->GetParent();
                    }
                    if (parent->GetType() == RegionTypeRoot)
                    {
                        continue;
                    }
                }
                this->InsertReturnThunkForRegion(this->currentRegion, restoreReturnValueFromBailoutLabel);
                if (instr->HasBailOutInfo())
                {
                    if (instr->GetBailOutInfo()->bailOutFunc == this->m_func)
                    {
                        // We dont set this bit for inlined code, if there was a bailout in the inlined code,
                        // and an exception was thrown, we want the caller's handler to handle the exception accordingly.
                        // TODO : Revisit when we start inlining functions with try-catch/try-finally
                        this->SetHasBailedOut(instr);
                    }
                    tmpInstr = this->EmitEHBailoutStackRestore(instr);
                    this->EmitSaveEHBailoutReturnValueAndJumpToRetThunk(tmpInstr);
                    if (!restoreReturnFromBailoutEmitted)
                    {
                        this->EmitRestoreReturnValueFromEHBailout(restoreReturnValueFromBailoutLabel, epilogLabel);
                        restoreReturnFromBailoutEmitted = true;
                    }
                }
            }
        }
    }
    NEXT_INSTR_IN_FUNC_EDITING
}